

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_node.c
# Opt level: O2

void signal_node_msg(signal_node_t *node,uint msg)

{
  char *pcVar1;
  undefined8 uVar2;
  
  if (node == (signal_node_t *)0x0) {
    pcVar1 = "node";
    uVar2 = 0xe3;
  }
  else {
    if (msg == 1) {
      node->run = 1;
      sem_post((sem_t *)&node->sem);
      return;
    }
    if (msg == 0) {
      node->run = 0;
      return;
    }
    pcVar1 = "0 == \"Bad signal_node_t message.\"";
    uVar2 = 0xed;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/signal_node.c"
                ,uVar2,pcVar1);
}

Assistant:

void signal_node_msg(signal_node_t *node, unsigned int msg)
{
    CILK_ASSERT(node);
    switch (msg) {
    case 0:                    // worker should go to sleep.
        node->run = msg;
        break;
    case 1:                    // worker should be awake.
        node->run = msg;
        signal_cilk_semaphore(&node->sem);
        break;
    default:                   // error.
        CILK_ASSERT(0 == "Bad signal_node_t message.");
    }
}